

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O1

void __thiscall
PatternParser::parseVariablePattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  size_type *psVar1;
  pointer pbVar2;
  iterator __position;
  iterator __position_00;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  InputError *pIVar6;
  string *s;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pointer local_70;
  double factor;
  vector<double,std::allocator<double>> *local_60;
  undefined1 local_58 [8];
  string timeUnits;
  
  pbVar2 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  timeUnits.field_2._8_8_ =
       (ulong)((long)(tokenList->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5;
  if ((int)timeUnits.field_2._8_8_ < 2) {
    pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    InputError::InputError(pIVar6,2,&local_f0);
    __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
  }
  psVar1 = &timeUnits._M_string_length;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"VARIABLE","");
  bVar4 = Utilities::match(pbVar2 + 1,(string *)local_58);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if (!bVar4) {
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    factor = (double)(pattern + 1);
    local_60 = (vector<double,std::allocator<double>> *)&pattern->factors;
    iVar7 = 2;
    do {
      s = pbVar2 + 2;
      iVar5 = Utilities::getSeconds(pbVar2 + 1,(string *)local_58);
      if (iVar5 < 0) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        std::operator+(&local_90,pbVar2 + 1," ");
        std::operator+(&local_110,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        InputError::InputError(pIVar6,7,&local_110);
        __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
      }
      if ((int)timeUnits.field_2._8_4_ <= iVar7) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
        InputError::InputError(pIVar6,2,&local_d0);
        __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar4 = Utilities::parseNumber<double>(s,(double *)&local_70);
      if (!bVar4) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar3 = (s->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
        InputError::InputError(pIVar6,6,&local_b0);
        __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
      }
      local_90._M_dataplus._M_p._0_4_ = iVar5;
      __position._M_current = (int *)pattern[1].super_Element.name._M_dataplus._M_p;
      if (__position._M_current == (int *)pattern[1].super_Element.name._M_string_length) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)factor,__position,(int *)&local_90);
      }
      else {
        *__position._M_current = iVar5;
        pattern[1].super_Element.name._M_dataplus._M_p = (pointer)(__position._M_current + 1);
      }
      local_90._M_dataplus._M_p = local_70;
      __position_00._M_current =
           (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_60,__position_00,(double *)&local_90);
      }
      else {
        *__position_00._M_current = (double)local_70;
        (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      iVar5 = iVar7 + 1;
      pbVar2 = s;
      iVar7 = iVar7 + 2;
    } while (iVar5 < (int)timeUnits.field_2._8_4_);
    if (local_58 != (undefined1  [8])&timeUnits._M_string_length) {
      operator_delete((void *)local_58);
    }
  }
  return;
}

Assistant:

void PatternParser::parseVariablePattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  VARIABLE
    //     PatternName  time1  factor1  time2  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to VariablePattern

    VariablePattern* varPat = static_cast<VariablePattern*>(pattern);

    // ... return if second token is the pattern type keyword

    if ( Utilities::match(tokens[1], "VARIABLE") ) return;

    // ... read in pairs of times and pattern factors
    //     (times can be in decimal hours or hours:minutes format)

    string timeUnits("");
    int    seconds;
    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        seconds = Utilities::getSeconds(tokens[i], timeUnits);
        if ( seconds < 0 )
        {
            throw InputError(InputError::INVALID_TIME, tokens[i] + " " + timeUnits);
        }
        i++;
        if ( i >= nTokens ) throw InputError(InputError::TOO_FEW_ITEMS, "");
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        varPat->addTime(seconds);
        varPat->addFactor(factor);
        i++;
    }
}